

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O1

string * iutest::detail::StringRemoveComment(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  lVar1 = std::__cxx11::string::find((char)str,10);
  if (lVar1 != -1) {
    lVar2 = 0;
    do {
      lVar3 = lVar1 + 1;
      if ((str->_M_dataplus)._M_p[lVar2] != '#') {
        std::__cxx11::string::substr((ulong)local_50,(ulong)str);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      lVar1 = std::__cxx11::string::find((char)str,10);
      lVar2 = lVar3;
    } while (lVar1 != -1);
  }
  if ((str->_M_dataplus)._M_p[lVar3] != '#') {
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string StringRemoveComment(const ::std::string& str)
{
    ::std::string r;
    ::std::string::size_type prev = 0;
    ::std::string::size_type pos = str.find('\n', 0);
    while( pos != ::std::string::npos )
    {
        ++pos;
        if( str[prev] != '#' ) {
            r += str.substr(prev, pos-prev);
        }
        prev = pos;
        pos = str.find('\n', pos);
    }
    if( str[prev] != '#' ) {
        r += str.substr(prev);
    }
    return r;
}